

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2.cc
# Opt level: O0

bool __thiscall
re2::RE2::Rewrite(RE2 *this,string *out,StringPiece *rewrite,StringPiece *vec,int veclen)

{
  StringPiece *pSVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  ostream *poVar5;
  int local_384;
  LogMessage local_370;
  undefined1 local_1f0 [8];
  StringPiece snip;
  LogMessage local_1d0;
  int local_50;
  int local_4c;
  int n;
  int c;
  char *end;
  char *s;
  StringPiece *pSStack_30;
  int veclen_local;
  StringPiece *vec_local;
  StringPiece *rewrite_local;
  string *out_local;
  RE2 *this_local;
  
  s._4_4_ = veclen;
  pSStack_30 = vec;
  vec_local = rewrite;
  rewrite_local = (StringPiece *)out;
  out_local = &this->pattern_;
  pcVar4 = StringPiece::data(rewrite);
  end = pcVar4;
  iVar3 = StringPiece::size(vec_local);
  _n = pcVar4 + iVar3;
  do {
    if (_n <= end) {
      return true;
    }
    if (*end == '\\') {
      end = end + 1;
      if (end < _n) {
        local_384 = (int)*end;
      }
      else {
        local_384 = -1;
      }
      local_4c = local_384;
      iVar3 = isdigit(local_384);
      if (iVar3 == 0) {
        if (local_4c != 0x5c) {
          bVar2 = Options::log_errors(&this->options_);
          if (bVar2) {
            LogMessage::LogMessage
                      (&local_370,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x37e,2);
            poVar5 = LogMessage::stream(&local_370);
            poVar5 = std::operator<<(poVar5,"invalid rewrite pattern: ");
            pcVar4 = StringPiece::data(vec_local);
            std::operator<<(poVar5,pcVar4);
            LogMessage::~LogMessage(&local_370);
          }
          return false;
        }
        std::__cxx11::string::push_back((char)rewrite_local);
      }
      else {
        local_50 = local_4c + -0x30;
        if (s._4_4_ <= local_50) {
          bVar2 = Options::log_errors(&this->options_);
          if (bVar2) {
            LogMessage::LogMessage
                      (&local_1d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/re2.cc"
                       ,0x372,2);
            poVar5 = LogMessage::stream(&local_1d0);
            poVar5 = std::operator<<(poVar5,"requested group ");
            poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_50);
            poVar5 = std::operator<<(poVar5," in regexp ");
            pcVar4 = StringPiece::data(vec_local);
            std::operator<<(poVar5,pcVar4);
            LogMessage::~LogMessage(&local_1d0);
          }
          return false;
        }
        local_1f0 = (undefined1  [8])pSStack_30[local_50].ptr_;
        snip.ptr_ = *(char **)&pSStack_30[local_50].length_;
        iVar3 = StringPiece::size((StringPiece *)local_1f0);
        pSVar1 = rewrite_local;
        if (0 < iVar3) {
          pcVar4 = StringPiece::data((StringPiece *)local_1f0);
          StringPiece::size((StringPiece *)local_1f0);
          std::__cxx11::string::append((char *)pSVar1,(ulong)pcVar4);
        }
      }
    }
    else {
      std::__cxx11::string::push_back((char)rewrite_local);
    }
    end = end + 1;
  } while( true );
}

Assistant:

bool RE2::Rewrite(string *out, const StringPiece &rewrite,
                 const StringPiece *vec, int veclen) const {
  for (const char *s = rewrite.data(), *end = s + rewrite.size();
       s < end; s++) {
    if (*s != '\\') {
      out->push_back(*s);
      continue;
    }
    s++;
    int c = (s < end) ? *s : -1;
    if (isdigit(c)) {
      int n = (c - '0');
      if (n >= veclen) {
        if (options_.log_errors()) {
          LOG(ERROR) << "requested group " << n
                     << " in regexp " << rewrite.data();
        }
        return false;
      }
      StringPiece snip = vec[n];
      if (snip.size() > 0)
        out->append(snip.data(), snip.size());
    } else if (c == '\\') {
      out->push_back('\\');
    } else {
      if (options_.log_errors())
        LOG(ERROR) << "invalid rewrite pattern: " << rewrite.data();
      return false;
    }
  }
  return true;
}